

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char_int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
      *this)

{
  size_t *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined1 in_ZMM1 [64];
  char local_9;
  
  auVar3._0_8_ = (this->position).chars_read_total;
  auVar3._8_8_ = (this->position).chars_read_current_line;
  auVar2 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar3 = vpsubq_avx(auVar3,auVar2);
  (this->position).chars_read_total = auVar3._0_8_;
  (this->position).chars_read_current_line = auVar3._8_8_;
  if (this->next_unget == true) {
    this->next_unget = false;
    iVar4 = this->current;
  }
  else {
    iVar4 = input_stream_adapter::get_character(&this->ia);
    this->current = iVar4;
  }
  if (iVar4 == -1) {
    iVar4 = -1;
  }
  else {
    local_9 = (char)iVar4;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->token_string,&local_9);
    iVar4 = this->current;
    if (iVar4 == 10) {
      psVar1 = &(this->position).lines_read;
      *psVar1 = *psVar1 + 1;
      (this->position).chars_read_current_line = 0;
      iVar4 = 10;
    }
  }
  return iVar4;
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }